

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void constInsert(WhereConst *pConst,Expr *pColumn,Expr *pValue)

{
  Expr **ppEVar1;
  Expr *pExpr;
  Expr *pEStack_20;
  int i;
  Expr *pValue_local;
  Expr *pColumn_local;
  WhereConst *pConst_local;
  
  pExpr._4_4_ = 0;
  while( true ) {
    if (pConst->nConst <= pExpr._4_4_) {
      pConst->nConst = pConst->nConst + 1;
      ppEVar1 = (Expr **)sqlite3DbReallocOrFree
                                   (pConst->pParse->db,pConst->apExpr,
                                    (long)(pConst->nConst << 1) << 3);
      pConst->apExpr = ppEVar1;
      if (pConst->apExpr == (Expr **)0x0) {
        pConst->nConst = 0;
      }
      else {
        pEStack_20 = pValue;
        if ((pValue->flags & 8) != 0) {
          pEStack_20 = pValue->pLeft;
        }
        pConst->apExpr[pConst->nConst * 2 + -2] = pColumn;
        pConst->apExpr[pConst->nConst * 2 + -1] = pEStack_20;
      }
      return;
    }
    if ((pConst->apExpr[pExpr._4_4_ << 1]->iTable == pColumn->iTable) &&
       (pConst->apExpr[pExpr._4_4_ << 1]->iColumn == pColumn->iColumn)) break;
    pExpr._4_4_ = pExpr._4_4_ + 1;
  }
  return;
}

Assistant:

static void constInsert(
  WhereConst *pConst,      /* The WhereConst into which we are inserting */
  Expr *pColumn,           /* The COLUMN part of the constraint */
  Expr *pValue             /* The VALUE part of the constraint */
){
  int i;
  assert( pColumn->op==TK_COLUMN );

  /* 2018-10-25 ticket [cf5ed20f]
  ** Make sure the same pColumn is not inserted more than once */
  for(i=0; i<pConst->nConst; i++){
    const Expr *pExpr = pConst->apExpr[i*2];
    assert( pExpr->op==TK_COLUMN );
    if( pExpr->iTable==pColumn->iTable
     && pExpr->iColumn==pColumn->iColumn
    ){
      return;  /* Already present.  Return without doing anything. */
    }
  }

  pConst->nConst++;
  pConst->apExpr = sqlite3DbReallocOrFree(pConst->pParse->db, pConst->apExpr,
                         pConst->nConst*2*sizeof(Expr*));
  if( pConst->apExpr==0 ){
    pConst->nConst = 0;
  }else{
    if( ExprHasProperty(pValue, EP_FixedCol) ) pValue = pValue->pLeft;
    pConst->apExpr[pConst->nConst*2-2] = pColumn;
    pConst->apExpr[pConst->nConst*2-1] = pValue;
  }
}